

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O3

int main(void)

{
  size_t n;
  bool bVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  sizes sVar9;
  sizes sVar10;
  sizes sVar11;
  sizes sVar12;
  size_t local_40;
  size_t local_38;
  
  n = 10;
  do {
    printf("%-10zu ",n);
    sVar9 = fuse16(n);
    sVar10 = fuse8(n);
    sVar11 = xor16(n);
    sVar12 = xor8(n);
    dVar2 = (double)(long)n;
    auVar5._8_4_ = sVar9.pack._4_4_;
    auVar5._0_8_ = sVar9.pack;
    auVar5._12_4_ = 0x45300000;
    printf("fuse16: %5.2f %5.2f   ",((double)(long)sVar9.standard * 8.0) / dVar2,
           (((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar9.pack) - 4503599627370496.0)) * 8.0) / dVar2);
    auVar6._8_4_ = sVar10.pack._4_4_;
    auVar6._0_8_ = sVar10.pack;
    auVar6._12_4_ = 0x45300000;
    printf("fuse8: %5.2f %5.2f   ",((double)(long)sVar10.standard * 8.0) / dVar2,
           (((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar10.pack) - 4503599627370496.0)) * 8.0) / dVar2);
    auVar3._8_4_ = sVar11.standard._4_4_;
    auVar3._0_8_ = sVar11.standard;
    auVar3._12_4_ = 0x45300000;
    auVar7._8_4_ = sVar11.pack._4_4_;
    auVar7._0_8_ = sVar11.pack;
    auVar7._12_4_ = 0x45300000;
    printf("xor16: %5.2f %5.2f   ",
           (((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar11.standard) - 4503599627370496.0)) * 8.0) / dVar2
           ,(((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar11.pack) - 4503599627370496.0)) * 8.0) / dVar2);
    local_40 = sVar12.standard;
    auVar4._8_4_ = sVar12.standard._4_4_;
    auVar4._0_8_ = local_40;
    auVar4._12_4_ = 0x45300000;
    local_38 = sVar12.pack;
    auVar8._8_4_ = sVar12.pack._4_4_;
    auVar8._0_8_ = local_38;
    auVar8._12_4_ = 0x45300000;
    printf("xor8: %5.2f %5.2f   ",
           (((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar12.standard) - 4503599627370496.0)) * 8.0) / dVar2
           ,(((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar12.pack) - 4503599627370496.0)) * 8.0) / dVar2);
    putchar(10);
    bVar1 = n < 0x4c4b41;
    n = n * 2;
  } while (bVar1);
  return 0;
}

Assistant:

int main() {
    for (size_t n = 10; n <= 10000000; n *= 2) {
        printf("%-10zu ", n);  // Align number to 10 characters wide
        sizes f16 = fuse16(n);
        sizes f8 = fuse8(n);
        sizes x16 = xor16(n);
        sizes x8 = xor8(n);
        
        printf("fuse16: %5.2f %5.2f   ", (double)f16.standard * 8.0 / n, (double)f16.pack * 8.0 / n);
        printf("fuse8: %5.2f %5.2f   ", (double)f8.standard  * 8.0 / n, (double)f8.pack  * 8.0 / n);
        printf("xor16: %5.2f %5.2f   ", (double)x16.standard  * 8.0 / n, (double)x16.pack  * 8.0 / n);
        printf("xor8: %5.2f %5.2f   ", (double)x8.standard  * 8.0 / n, (double)x8.pack  * 8.0 / n);
        printf("\n");
    }
    return EXIT_SUCCESS;
}